

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadstate.cpp
# Opt level: O1

void __thiscall
ThreadState::ThreadState(ThreadState *this,TID own_tid,shared_ptr<ThreadState> *parent)

{
  element_type *that;
  TID local_58 [2];
  __atomic_base<unsigned_long> local_50;
  _Head_base<0UL,_unsigned_int_&&,_false> local_48;
  _Head_base<0UL,_unsigned_long_&&,_false> local_40;
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>::iterator,_bool>
  local_38;
  
  (this->super_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>).vc.
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .ctrl_ = phmap::container_internal::EmptyGroup()::empty_group;
  (this->super_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>).vc.
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .settings_.
  super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_0UL,_false>
  .value = 0;
  (this->super_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>).vc.
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .slots_ = (slot_type *)0x0;
  (this->super_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>).vc.
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .size_ = 0;
  (this->super_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>).vc.
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .capacity_ = 0;
  (this->id).super___atomic_base<unsigned_long>._M_i = (ulong)own_tid << 0x20;
  StackTrace::StackTrace(&this->traceDepot);
  local_40._M_head_impl = &local_50._M_i;
  local_50._M_i = (this->id).super___atomic_base<unsigned_long>._M_i;
  local_48._M_head_impl = local_58;
  local_58[0] = own_tid;
  phmap::container_internal::
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>
  ::
  emplace_decomposable<unsigned_int,std::piecewise_construct_t_const&,std::tuple<unsigned_int&&>,std::tuple<unsigned_long&&>>
            (&local_38,
             (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>
              *)this,local_48._M_head_impl,
             SUB168(ZEXT416(own_tid) * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(ZEXT416(own_tid) * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,(tuple<unsigned_int_&&> *)&local_48,
             (tuple<unsigned_long_&&> *)&local_40);
  that = (parent->super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (that != (element_type *)0x0) {
    phmap::container_internal::
    raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
    ::operator=((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                 *)this,(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                         *)that);
  }
  return;
}

Assistant:

ThreadState::ThreadState(VectorClock::TID own_tid,
                         const std::shared_ptr<ThreadState>& parent)
    : id(VectorClock::make_id(own_tid)) {
  vc.insert({own_tid, id});
  if (parent != nullptr) {
    // if parent exists vector clock
    vc = parent->vc;
  }
}